

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueCommandBufferKHR
                 (cl_uint num_queues,cl_command_queue *queues,cl_command_buffer_khr command_buffer,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  uint64_t enqueueCounter_00;
  bool bVar1;
  undefined1 uVar2;
  SConfig *pSVar3;
  undefined8 uVar4;
  CLIntercept *pCVar5;
  cl_icd_dispatch *pcVar6;
  CObjectTracker *pCVar7;
  cl_uint in_ECX;
  cl_command_buffer_khr in_RDX;
  cl_command_queue *in_RSI;
  cl_uint in_EDI;
  cl_event *in_R8;
  cl_event *in_R9;
  CLIntercept *in_stack_000000a8;
  time_point toolEnd_1;
  time_point toolStart_1;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  string eventWaitListString;
  string queueList;
  cl_command_queue command_queue;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  cl_command_buffer_khr in_stack_fffffffffffffb18;
  cl_command_queue in_stack_fffffffffffffb20;
  cl_command_buffer_khr in_stack_fffffffffffffb28;
  CLIntercept *in_stack_fffffffffffffb30;
  allocator *paVar8;
  CObjectTracker *in_stack_fffffffffffffb38;
  uint64_t in_stack_fffffffffffffb40;
  CLIntercept *in_stack_fffffffffffffb48;
  CLIntercept *in_stack_fffffffffffffb50;
  SConfig *in_stack_fffffffffffffb78;
  CLIntercept *in_stack_fffffffffffffb80;
  CLIntercept *in_stack_fffffffffffffb88;
  cl_event p_Var9;
  cl_event *in_stack_fffffffffffffb90;
  cl_event *in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  cl_uint numEvents;
  char *in_stack_fffffffffffffba8;
  CLIntercept *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  undefined1 includeId;
  SConfig *in_stack_fffffffffffffbc0;
  SConfig *in_stack_fffffffffffffbc8;
  CLIntercept *in_stack_fffffffffffffbd0;
  time_point in_stack_fffffffffffffbd8;
  time_point in_stack_fffffffffffffbe0;
  time_point in_stack_fffffffffffffbe8;
  time_point in_stack_fffffffffffffbf0;
  cl_command_buffer_khr in_stack_fffffffffffffc00;
  cl_command_queue *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  cl_uint numQueues;
  undefined6 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1e;
  undefined1 in_stack_fffffffffffffc1f;
  allocator *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  CLIntercept *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined2 in_stack_fffffffffffffc3c;
  undefined1 in_stack_fffffffffffffc3e;
  byte bVar10;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffc3f;
  CLIntercept *in_stack_fffffffffffffc40;
  SConfig *in_stack_fffffffffffffc48;
  SConfig *in_stack_fffffffffffffc50;
  time_point in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  int local_2fc;
  undefined8 local_2f8;
  undefined8 local_2f0;
  allocator local_2e1;
  string local_2e0 [20];
  cl_int in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  cl_int in_stack_fffffffffffffd3c;
  CLIntercept *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  CLIntercept *in_stack_fffffffffffffd50;
  string local_2a8 [32];
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  allocator local_251;
  string local_250 [32];
  undefined8 local_230;
  undefined8 local_228;
  allocator local_219;
  string local_218 [8];
  undefined8 local_1d8;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  CLIntercept *local_170;
  byte local_163;
  byte local_162;
  allocator local_161;
  string local_160 [32];
  undefined8 local_140;
  undefined8 local_138;
  allocator local_129;
  string local_128 [32];
  undefined8 local_108;
  undefined8 local_100;
  size_t *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  cl_kernel in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar12;
  cl_event in_stack_ffffffffffffff28;
  CLIntercept *in_stack_ffffffffffffff30;
  string local_c8 [8];
  size_t *in_stack_ffffffffffffff40;
  cl_command_queue in_stack_ffffffffffffff48;
  string local_98 [32];
  string local_78 [32];
  cl_command_queue local_58;
  uint64_t local_50;
  cl_int local_44;
  CLdispatchX *local_40;
  CLIntercept *local_38;
  cl_event *local_30;
  cl_event *local_28;
  cl_uint local_1c;
  cl_command_buffer_khr local_18;
  cl_command_queue *local_10;
  cl_uint local_8;
  cl_int local_4;
  
  includeId = (undefined1)((ulong)in_stack_fffffffffffffbb8 >> 0x38);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffba0 >> 0x20);
  numQueues = (cl_uint)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_38 = GetIntercept();
  if ((local_38 == (CLIntercept *)0x0) ||
     (local_40 = CLIntercept::dispatchX(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28),
     local_40->clEnqueueCommandBufferKHR ==
     (_func_cl_int_cl_uint_cl_command_queue_ptr_cl_command_buffer_khr_cl_uint_cl_event_ptr_cl_event_ptr
      *)0x0)) {
    local_2fc = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_2fc);
    local_4 = -0x472;
  }
  else {
    local_44 = 0;
    local_50 = CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffb88);
    local_58 = CLIntercept::getCommandBufferCommandQueue
                         ((CLIntercept *)
                          CONCAT17(in_stack_fffffffffffffc1f,
                                   CONCAT16(in_stack_fffffffffffffc1e,in_stack_fffffffffffffc18)),
                          numQueues,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    pSVar3 = CLIntercept::config(local_38);
    if ((((pSVar3->AubCapture & 1U) != 0) &&
        (bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(local_38,local_50), bVar1)) &&
       (pSVar3 = CLIntercept::config(local_38), (pSVar3->AubCaptureIndividualEnqueues & 1U) == 0)) {
      in_stack_fffffffffffffb18 = (cl_command_buffer_khr)0x0;
      in_stack_fffffffffffffb20 = local_58;
      CLIntercept::startAubCapture
                (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18,(cl_uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                 in_stack_ffffffffffffff08,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    }
    pSVar3 = CLIntercept::config(local_38);
    if ((pSVar3->NullEnqueue & 1U) == 0) {
      std::__cxx11::string::string(local_78);
      std::__cxx11::string::string(local_98);
      pSVar3 = CLIntercept::config(local_38);
      if ((pSVar3->CallLogging & 1U) != 0) {
        CLIntercept::getObjectListString<_cl_command_queue*>
                  (in_stack_fffffffffffffc40,
                   CONCAT13(in_stack_fffffffffffffc3f,
                            CONCAT12(in_stack_fffffffffffffc3e,in_stack_fffffffffffffc3c)),
                   (_cl_command_queue **)in_stack_fffffffffffffc30,
                   (string *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
        getFormattedEventWaitList_abi_cxx11_
                  (in_stack_fffffffffffffb48,(cl_uint)(in_stack_fffffffffffffb40 >> 0x20),
                   (cl_event *)in_stack_fffffffffffffb38);
        std::__cxx11::string::operator=(local_98,local_c8);
        std::__cxx11::string::~string(local_c8);
      }
      pSVar3 = CLIntercept::config(local_38);
      pCVar5 = local_38;
      enqueueCounter_00 = local_50;
      if ((pSVar3->CallLogging & 1U) != 0) {
        uVar4 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffb18 = local_18;
        in_stack_fffffffffffffb20 = (cl_command_queue)std::__cxx11::string::c_str();
        CLIntercept::callLoggingEnter
                  (pCVar5,"clEnqueueCommandBufferKHR",enqueueCounter_00,(cl_kernel)0x0,
                   "queues = %s, command_buffer = %p%s",uVar4);
      }
      pSVar3 = CLIntercept::config(local_38);
      if ((pSVar3->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,numEvents,
                   in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb20);
      bVar12 = 0;
      pSVar3 = CLIntercept::config(local_38);
      if (((((pSVar3->DevicePerformanceTiming & 1U) != 0) ||
           (pSVar3 = CLIntercept::config(local_38), (pSVar3->ITTPerformanceTiming & 1U) != 0)) ||
          ((pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromePerformanceTiming & 1U) != 0 ||
           (pSVar3 = CLIntercept::config(local_38),
           (pSVar3->DevicePerfCounterEventBasedSampling & 1U) != 0)))) &&
         (in_stack_ffffffffffffff30 = (CLIntercept *)std::chrono::_V2::steady_clock::now(),
         local_30 == (cl_event *)0x0)) {
        local_30 = (cl_event *)&stack0xffffffffffffff28;
        bVar12 = 1;
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb20);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb20);
      pSVar3 = CLIntercept::config(local_38);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromeCallLogging & 1U) != 0)) {
        local_100 = std::chrono::_V2::steady_clock::now();
        in_stack_ffffffffffffff10 = local_100;
      }
      local_44 = (*local_40->clEnqueueCommandBufferKHR)
                           (local_8,local_10,local_18,local_1c,local_28,local_30);
      pSVar3 = CLIntercept::config(local_38);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromeCallLogging & 1U) != 0)) {
        local_108 = std::chrono::_V2::steady_clock::now();
        uVar4 = local_108;
        pSVar3 = CLIntercept::config(local_38);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (in_stack_fffffffffffffc77 =
                 CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_38,local_50),
           (bool)in_stack_fffffffffffffc77)) {
          in_stack_fffffffffffffc60.__d.__r = (duration)(duration)local_38;
          std::allocator<char>::allocator();
          local_140 = uVar4;
          local_138 = in_stack_ffffffffffffff10;
          std::__cxx11::string::string(local_128,"",&local_129);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbe0.__d.__r,
                     (char *)in_stack_fffffffffffffbd8.__d.__r,(string *)in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
        }
      }
      pCVar5 = (CLIntercept *)CLIntercept::config(local_38);
      if (((((((ulong)(pCVar5->m_Dispatch).clCreateContextFromType & 0x10000) != 0) ||
            (in_stack_fffffffffffffc50 = CLIntercept::config(local_38),
            (in_stack_fffffffffffffc50->ITTPerformanceTiming & 1U) != 0)) ||
           (in_stack_fffffffffffffc48 = CLIntercept::config(local_38),
           (in_stack_fffffffffffffc48->ChromePerformanceTiming & 1U) != 0)) ||
          (in_stack_fffffffffffffc40 = (CLIntercept *)CLIntercept::config(local_38),
          ((ulong)(in_stack_fffffffffffffc40->m_Dispatch).clSetCommandQueueProperty & 1) != 0)) &&
         (local_30 != (cl_event *)0x0)) {
        local_162 = 0;
        local_163 = 0;
        uVar2 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(local_38,local_50);
        bVar10 = false;
        if ((bool)uVar2) {
          in_stack_fffffffffffffc30 = (CLIntercept *)CLIntercept::config(local_38);
          in_stack_fffffffffffffc2f = true;
          bVar10 = in_stack_fffffffffffffc2f;
          if (((ulong)(in_stack_fffffffffffffc30->m_Dispatch).clRetainContext & 0x100) != 0) {
            in_stack_fffffffffffffc20 = &local_161;
            std::allocator<char>::allocator();
            local_162 = 1;
            std::__cxx11::string::string
                      (local_160,"clEnqueueCommandBufferKHR",in_stack_fffffffffffffc20);
            local_163 = 1;
            in_stack_fffffffffffffc2f =
                 std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
            bVar10 = in_stack_fffffffffffffc2f;
          }
        }
        uVar11 = bVar10;
        if ((local_163 & 1) != 0) {
          std::__cxx11::string::~string(local_160);
        }
        if ((local_162 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
        }
        if ((bVar10 & 1) != 0) {
          paVar8 = &local_191;
          local_170 = in_stack_ffffffffffffff30;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_190,"",paVar8);
          CLIntercept::addTimingEvent
                    (pCVar5,&in_stack_fffffffffffffc50->SuppressLogging,
                     (uint64_t)in_stack_fffffffffffffc48,in_stack_fffffffffffffc60,
                     (string *)in_stack_fffffffffffffc40,
                     (cl_command_queue)
                     CONCAT17(uVar2,CONCAT16(uVar11,CONCAT24(in_stack_fffffffffffffc3c,
                                                             in_stack_fffffffffffffc38))),
                     (cl_event)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
          std::__cxx11::string::~string(local_190);
          std::allocator<char>::~allocator((allocator<char> *)&local_191);
        }
        if ((bVar12 & 1) != 0) {
          pcVar6 = CLIntercept::dispatch(local_38);
          (*pcVar6->clReleaseEvent)(*local_30);
          local_30 = (cl_event *)0x0;
        }
      }
      in_stack_fffffffffffffbf0.__d.__r = (duration)CLIntercept::config(local_38);
      if (((((((SConfig *)in_stack_fffffffffffffbf0.__d.__r)->ErrorLogging & 1U) != 0) ||
           (in_stack_fffffffffffffbe8.__d.__r = (duration)CLIntercept::config(local_38),
           (((SConfig *)in_stack_fffffffffffffbe8.__d.__r)->ErrorAssert & 1U) != 0)) ||
          (in_stack_fffffffffffffbe0.__d.__r = (duration)CLIntercept::config(local_38),
          ((ulong)(((CLIntercept *)in_stack_fffffffffffffbe0.__d.__r)->m_Dispatch).
                  clCreateSubDevices & 0x100000000) != 0)) && (local_44 != 0)) {
        in_stack_fffffffffffffbd8.__d.__r = (duration)CLIntercept::config(local_38);
        if ((((SConfig *)in_stack_fffffffffffffbd8.__d.__r)->ErrorLogging & 1U) != 0) {
          CLIntercept::logError
                    (in_stack_fffffffffffffd40,
                     (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     in_stack_fffffffffffffd34);
        }
        in_stack_fffffffffffffbd0 = (CLIntercept *)CLIntercept::config(local_38);
        if (((in_stack_fffffffffffffbd0->m_Mutex).super___mutex_base._M_mutex.__size[0x14] & 1U) !=
            0) {
          raise(5);
        }
        in_stack_fffffffffffffbc8 = CLIntercept::config(local_38);
        if ((in_stack_fffffffffffffbc8->NoErrors & 1U) != 0) {
          local_44 = 0;
        }
      }
      in_stack_fffffffffffffbc0 = CLIntercept::config(local_38);
      if ((in_stack_fffffffffffffbc0->LeakChecking & 1U) != 0) {
        pCVar7 = CLIntercept::objectTracker(local_38);
        includeId = (undefined1)((ulong)pCVar7 >> 0x38);
        if (local_30 == (cl_event *)0x0) {
          in_stack_fffffffffffffbb0 = (CLIntercept *)0x0;
        }
        else {
          in_stack_fffffffffffffbb0 = (CLIntercept *)*local_30;
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffb38,(_cl_event *)in_stack_fffffffffffffb30);
      }
      pSVar3 = CLIntercept::config(local_38);
      if ((pSVar3->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffbb0,&pSVar3->SuppressLogging,numEvents,
                   in_stack_fffffffffffffb98,(cl_sync_point_khr *)in_stack_fffffffffffffb90);
      }
      pSVar3 = CLIntercept::config(local_38);
      if ((pSVar3->ChromeCallLogging & 1U) != 0) {
        paVar8 = &local_1b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b8,"",paVar8);
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffbd0,&in_stack_fffffffffffffbc8->SuppressLogging,
                   (string *)in_stack_fffffffffffffbc0,(bool)includeId,
                   (uint64_t)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbe0,
                   in_stack_fffffffffffffbd8);
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      if (local_30 == (cl_event *)0x0) {
        p_Var9 = (cl_event)0x0;
      }
      else {
        p_Var9 = *local_30;
      }
      if ((p_Var9 != (cl_event)0x0) &&
         ((in_stack_fffffffffffffb80 = (CLIntercept *)CLIntercept::config(local_38),
          ((in_stack_fffffffffffffb80->m_Mutex).super___mutex_base._M_mutex.__size[0x11] & 1U) != 0
          || (in_stack_fffffffffffffb78 = CLIntercept::config(local_38),
             (in_stack_fffffffffffffb78->ChromePerformanceTiming & 1U) != 0)))) {
        CLIntercept::addEvent
                  (in_stack_fffffffffffffb50,(cl_event)in_stack_fffffffffffffb48,
                   in_stack_fffffffffffffb40);
      }
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_78);
    }
    pSVar3 = CLIntercept::config(local_38);
    if ((pSVar3->FinishAfterEnqueue & 1U) == 0) {
      pSVar3 = CLIntercept::config(local_38);
      if ((pSVar3->FlushAfterEnqueue & 1U) != 0) {
        pcVar6 = CLIntercept::dispatch(local_38);
        (*pcVar6->clFlush)(local_58);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb20);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb20);
      pSVar3 = CLIntercept::config(local_38);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_38), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_1d8 = std::chrono::_V2::steady_clock::now();
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                (in_stack_fffffffffffffc30,
                 (char *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                 (char *)in_stack_fffffffffffffc20);
      pcVar6 = CLIntercept::dispatch(local_38);
      (*pcVar6->clFinish)(local_58);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (char *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      pSVar3 = CLIntercept::config(local_38);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_38), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        uVar4 = std::chrono::_V2::steady_clock::now();
        pSVar3 = CLIntercept::config(local_38);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_38,local_50), bVar1))
        {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_218,"",&local_219);
          local_228 = local_1d8;
          local_230 = uVar4;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbe0.__d.__r,
                     (char *)in_stack_fffffffffffffbd8.__d.__r,(string *)in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
          std::__cxx11::string::~string(local_218);
          std::allocator<char>::~allocator((allocator<char> *)&local_219);
        }
        pSVar3 = CLIntercept::config(local_38);
        if ((pSVar3->ChromeCallLogging & 1U) != 0) {
          paVar8 = &local_251;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_250,"",paVar8);
          local_260 = local_1d8;
          local_268 = uVar4;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffbd0,&in_stack_fffffffffffffbc8->SuppressLogging,
                     (string *)in_stack_fffffffffffffbc0,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbe0,
                     in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string(local_250);
          std::allocator<char>::~allocator((allocator<char> *)&local_251);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb20);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb20);
      pSVar3 = CLIntercept::config(local_38);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_38), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_280 = std::chrono::_V2::steady_clock::now();
        local_270 = local_280;
      }
      CLIntercept::checkTimingEvents(in_stack_000000a8);
      pSVar3 = CLIntercept::config(local_38);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_38), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_288 = std::chrono::_V2::steady_clock::now();
        local_278 = local_288;
        pSVar3 = CLIntercept::config(local_38);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_38,local_50), bVar1))
        {
          paVar8 = (allocator *)&stack0xfffffffffffffd57;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2a8,"",paVar8);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbe0.__d.__r,
                     (char *)in_stack_fffffffffffffbd8.__d.__r,(string *)in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
          std::__cxx11::string::~string(local_2a8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd57);
        }
        pSVar3 = CLIntercept::config(local_38);
        if ((pSVar3->ChromeCallLogging & 1U) != 0) {
          paVar8 = &local_2e1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e0,"",paVar8);
          local_2f0 = local_270;
          local_2f8 = local_278;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffbd0,&in_stack_fffffffffffffbc8->SuppressLogging,
                     (string *)in_stack_fffffffffffffbc0,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbe0,
                     in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string(local_2e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        }
      }
    }
    pSVar3 = CLIntercept::config(local_38);
    if (((pSVar3->AubCapture & 1U) != 0) &&
       ((pSVar3 = CLIntercept::config(local_38), (pSVar3->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(local_38,local_50), !bVar1)))) {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffb80,(cl_command_queue)in_stack_fffffffffffffb78);
    }
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueCommandBufferKHR(
    cl_uint num_queues,
    cl_command_queue* queues,
    cl_command_buffer_khr command_buffer,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clEnqueueCommandBufferKHR )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            COMMAND_BUFFER_GET_QUEUE( num_queues, queues, command_buffer );
            CHECK_AUBCAPTURE_START( command_queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                std::string queueList;
                std::string eventWaitListString;
                if( pIntercept->config().CallLogging )
                {
                    pIntercept->getObjectListString(
                        num_queues,
                        queues,
                        queueList );
                    eventWaitListString = getFormattedEventWaitList(
                        pIntercept,
                        num_events_in_wait_list,
                        event_wait_list);
                }
                CALL_LOGGING_ENTER( "queues = %s, command_buffer = %p%s",
                    queueList.c_str(),
                    command_buffer,
                    eventWaitListString.c_str() );
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueCommandBufferKHR(
                    num_queues,
                    queues,
                    command_buffer,
                    num_events_in_wait_list,
                    event_wait_list,
                    event);

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
            CHECK_AUBCAPTURE_STOP( command_queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}